

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_type.cpp
# Opt level: O2

FieldEncodingEnum
bidfx_public_api::price::pixie::FieldTypeMethods::DefaultEncoding(FieldTypeEnum field)

{
  undefined3 in_register_00000039;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000039,field);
  if (iVar1 == 0x20) {
    return NOOP;
  }
  if (iVar1 != 0x53) {
    if (iVar1 != 0x49) {
      return FIXED8;
    }
    return FIXED4;
  }
  return VARINT_STRING;
}

Assistant:

FieldEncodingEnum FieldTypeMethods::DefaultEncoding(FieldTypeEnum field)
{
    switch(field)
    {
        case UNRECOGNISED:
            return FieldEncodingEnum::NOOP;
        case DOUBLE:
            return FieldEncodingEnum::FIXED8;
        case INTEGER:
            return FieldEncodingEnum::FIXED4;
        case LONG:
            return FieldEncodingEnum::FIXED8;
        case STRING:
            return FieldEncodingEnum::VARINT_STRING;
    }
}